

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sameSrcAlias(SrcItem *p0,SrcList *pSrc)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (ulong)(uint)pSrc->nSrc;
  if (pSrc->nSrc < 1) {
    uVar3 = 0;
  }
  lVar4 = 0;
  while( true ) {
    if (uVar3 * 0x48 - lVar4 == 0) {
      return 0;
    }
    if (((SrcItem *)((long)&pSrc->a[0].zName + lVar4) != p0) &&
       (((p0->pSTab == *(Table **)((long)&pSrc->a[0].pSTab + lVar4) &&
         (iVar2 = sqlite3_stricmp(p0->zAlias,*(char **)((long)&pSrc->a[0].zAlias + lVar4)),
         iVar2 == 0)) ||
        ((((&pSrc->a[0].fg.field_0x1)[lVar4] & 4) != 0 &&
         ((lVar1 = **(long **)((long)&pSrc->a[0].u4 + lVar4), (*(byte *)(lVar1 + 5) & 8) != 0 &&
          (iVar2 = sameSrcAlias(p0,*(SrcList **)(lVar1 + 0x28)), iVar2 != 0)))))))) break;
    lVar4 = lVar4 + 0x48;
  }
  return 1;
}

Assistant:

static int sameSrcAlias(SrcItem *p0, SrcList *pSrc){
  int i;
  for(i=0; i<pSrc->nSrc; i++){
    SrcItem *p1 = &pSrc->a[i];
    if( p1==p0 ) continue;
    if( p0->pSTab==p1->pSTab && 0==sqlite3_stricmp(p0->zAlias, p1->zAlias) ){
      return 1;
    }
    if( p1->fg.isSubquery
     && (p1->u4.pSubq->pSelect->selFlags & SF_NestedFrom)!=0
     && sameSrcAlias(p0, p1->u4.pSubq->pSelect->pSrc)
    ){
      return 1;
    }
  }
  return 0;
}